

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O1

Context * Rml::GetContext(int index)

{
  ulong uVar1;
  code *pcVar2;
  ulong *puVar3;
  bool bVar4;
  int iVar5;
  ulong uVar7;
  ulong uVar8;
  uint8_t *puVar9;
  ulong *puVar10;
  iterator iVar11;
  NodePtr pDVar6;
  
  if (-1 < index) {
    uVar7 = (ulong)(uint)index;
    iVar5 = GetNumContexts();
    if (index < iVar5) {
      if ((core_data._8_8_ != 0) ||
         (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                         ,0x46), bVar4)) {
        iVar11 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(core_data._8_8_ + 0x38));
        pDVar6 = iVar11.mKeyVals;
        if (index != 0) {
          do {
            puVar9 = iVar11.mInfo;
            pDVar6 = iVar11.mKeyVals + 1;
            uVar8 = *(ulong *)(puVar9 + 1);
            if (uVar8 == 0) {
              puVar3 = (ulong *)(puVar9 + 9);
              do {
                puVar10 = puVar3;
                pDVar6 = pDVar6 + 8;
                uVar8 = *puVar10;
                puVar3 = puVar10 + 1;
              } while (uVar8 == 0);
            }
            else {
              puVar10 = (ulong *)(puVar9 + 1);
            }
            uVar7 = uVar7 - 1;
            uVar1 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
              }
            }
            uVar8 = uVar1 >> 3 & 0x1fffffff;
            pDVar6 = pDVar6 + uVar8;
            iVar11.mInfo = (uint8_t *)((long)puVar10 + uVar8);
            iVar11.mKeyVals = pDVar6;
          } while (uVar7 != 0);
        }
        if ((core_data._8_8_ != 0) ||
           (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                           ,0x46), bVar4)) {
          if (pDVar6 == *(NodePtr *)(core_data._8_8_ + 0x40)) {
            return (Context *)0x0;
          }
          return (pDVar6->mData).second._M_t.
                 super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
                 super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                 super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl;
        }
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  return (Context *)0x0;
}

Assistant:

Context* GetContext(int index)
{
	if (index < 0 || index >= GetNumContexts())
		return nullptr;

	auto it = core_data->contexts.begin();
	std::advance(it, index);

	if (it == core_data->contexts.end())
		return nullptr;

	return it->second.get();
}